

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteElement(xmlTextWriterPtr writer,xmlChar *name,xmlChar *content)

{
  int iVar1;
  int local_30;
  int sum;
  int count;
  xmlChar *content_local;
  xmlChar *name_local;
  xmlTextWriterPtr writer_local;
  
  local_30 = xmlTextWriterStartElement(writer,name);
  if (local_30 == -1) {
    writer_local._4_4_ = -1;
  }
  else {
    if (content != (xmlChar *)0x0) {
      iVar1 = xmlTextWriterWriteString(writer,content);
      if (iVar1 == -1) {
        return -1;
      }
      local_30 = iVar1 + local_30;
    }
    iVar1 = xmlTextWriterEndElement(writer);
    if (iVar1 == -1) {
      writer_local._4_4_ = -1;
    }
    else {
      writer_local._4_4_ = iVar1 + local_30;
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteElement(xmlTextWriterPtr writer, const xmlChar * name,
                          const xmlChar * content)
{
    int count;
    int sum;

    sum = 0;
    count = xmlTextWriterStartElement(writer, name);
    if (count == -1)
        return -1;
    sum += count;
    if (content != NULL) {
	count = xmlTextWriterWriteString(writer, content);
	if (count == -1)
	    return -1;
	sum += count;
    }
    count = xmlTextWriterEndElement(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}